

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O3

int gobj_shouldvis(t_gobj *x,_glist *glist)

{
  _class *p_Var1;
  _widgetbehavior *p_Var2;
  t_getrectfn p_Var3;
  int iVar4;
  t_object *ptVar5;
  int y2;
  int y1;
  int x2;
  int x1;
  int gy2;
  int gx2;
  int gy1;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  
  if (((*(ushort *)&glist->field_0xe8 & 0x101) == 0x100) &&
     (((byte)(*(ushort *)&glist->field_0xe8 >> 0xb) & 1) == 0 && glist->gl_owner != (_glist *)0x0))
  {
    iVar4 = gobj_shouldvis((t_gobj *)glist,glist->gl_owner);
    if (iVar4 == 0) {
      return 0;
    }
    if ((glist->field_0xe8 & 0x80) != 0) {
      if (x->g_pd == scalar_class) {
        return 1;
      }
      if (x->g_pd == garray_class) {
        return 1;
      }
      p_Var2 = ((glist->gl_obj).te_g.g_pd)->c_wb;
      if ((p_Var2 == (_widgetbehavior *)0x0) ||
         (p_Var3 = p_Var2->w_getrectfn, p_Var3 == (t_getrectfn)0x0)) {
        local_3c = 0;
        local_34 = 0;
        local_38 = 10;
        local_40 = 10;
      }
      else {
        (*p_Var3)((t_gobj *)glist,glist->gl_owner,&local_34,&local_3c,&local_38,&local_40);
        iVar4 = local_34;
        if (local_38 < local_34) {
          local_34 = local_38;
          local_38 = iVar4;
        }
      }
      iVar4 = local_3c;
      if (local_40 < local_3c) {
        local_3c = local_40;
        local_40 = iVar4;
      }
      p_Var2 = x->g_pd->c_wb;
      if ((p_Var2 == (_widgetbehavior *)0x0) ||
         (p_Var3 = p_Var2->w_getrectfn, p_Var3 == (t_getrectfn)0x0)) {
        local_28 = 0;
        local_30 = 10;
        local_2c = 10;
        local_24 = 0;
      }
      else {
        (*p_Var3)(x,glist,&local_24,&local_28,&local_2c,&local_30);
      }
      if (local_24 < local_34) {
        return 0;
      }
      if (local_38 < local_24) {
        return 0;
      }
      if (local_38 < local_2c || local_2c < local_34) {
        return 0;
      }
      if (local_28 < local_3c) {
        return 0;
      }
      if (local_40 < local_28) {
        return 0;
      }
      if (local_40 < local_30 || local_30 < local_3c) {
        return 0;
      }
    }
  }
  ptVar5 = pd_checkobject(&x->g_pd);
  if (ptVar5 == (t_object *)0x0) {
    return 1;
  }
  if ((*(ushort *)&glist->field_0xe8 & 1) != 0) {
    return 1;
  }
  p_Var1 = (ptVar5->te_g).g_pd;
  if (p_Var1 == canvas_class) {
    if ((ptVar5[4].te_xpix & 0x100) != 0) {
      return 1;
    }
  }
  else if (p_Var1->c_wb != &text_widgetbehavior) {
    return 1;
  }
  if (-1 < (char)*(ushort *)&glist->field_0xe8) {
    return 0;
  }
  return (uint)((ptVar5->field_0x2e & 3) == 0);
}

Assistant:

int gobj_shouldvis(t_gobj *x, struct _glist *glist)
{
    t_object *ob;
    int has_parent = !glist->gl_havewindow && glist->gl_isgraph
        && glist->gl_owner && !glist->gl_isclone;
        /* if our parent is a graph, and if that graph itself isn't
           visible, then we aren't either. */
    if (has_parent && !gobj_shouldvis(&glist->gl_gobj, glist->gl_owner))
            return (0);
        /* if we're graphing-on-parent and the object falls outside the
           graph rectangle, don't draw it. */
    if (has_parent && glist->gl_goprect)
    {
        int x1, y1, x2, y2, gx1, gy1, gx2, gy2, m;
            /* for some reason the bounds check on arrays and scalars
               don't seem to apply here.  Perhaps this was in order to allow
               arrays to reach outside their containers?  I no longer understand
               this. */
        if (pd_class(&x->g_pd) == scalar_class
            || pd_class(&x->g_pd) == garray_class)
                return (1);
        gobj_getrect(&glist->gl_gobj, glist->gl_owner, &x1, &y1, &x2, &y2);
        if (x1 > x2)
            m = x1, x1 = x2, x2 = m;
        if (y1 > y2)
            m = y1, y1 = y2, y2 = m;
        gobj_getrect(x, glist, &gx1, &gy1, &gx2, &gy2);
#if 0
        post("graph %d %d %d %d, %s %d %d %d %d",
             x1, x2, y1, y2, class_gethelpname(x->g_pd), gx1, gx2, gy1, gy2);
#endif
        if (gx1 < x1 || gx1 > x2 || gx2 < x1 || gx2 > x2 ||
            gy1 < y1 || gy1 > y2 || gy2 < y1 || gy2 > y2)
                return (0);
    }
    if ((ob = pd_checkobject(&x->g_pd)))
    {
            /* return true if the text box should be drawn.  We don't show text
               boxes inside graphs---except comments, if we're doing the new
               (goprect) style. */
        return (glist->gl_havewindow ||
            (ob->te_pd != canvas_class &&
                ob->te_pd->c_wb != &text_widgetbehavior) ||
            (ob->te_pd == canvas_class && (((t_glist *)ob)->gl_isgraph)) ||
            (glist->gl_goprect && (ob->te_type == T_TEXT)));
    }
    else return (1);
}